

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_SecureChannel_deleteMembersCleanup(UA_SecureChannel *channel)

{
  SessionEntry *pSVar1;
  ChunkEntry *pCVar2;
  ChunkEntry *temp_ch;
  ChunkEntry *ch;
  SessionEntry *temp;
  SessionEntry *se;
  UA_SecureChannel *channel_local;
  
  UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->serverAsymAlgSettings);
  UA_ByteString_deleteMembers(&channel->serverNonce);
  UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->clientAsymAlgSettings);
  UA_ByteString_deleteMembers(&channel->clientNonce);
  UA_ChannelSecurityToken_deleteMembers(&channel->securityToken);
  UA_ChannelSecurityToken_deleteMembers(&channel->nextSecurityToken);
  if (channel->connection != (UA_Connection *)0x0) {
    UA_Connection_detachSecureChannel(channel->connection);
  }
  temp = (channel->sessions).lh_first;
  while (temp != (SessionEntry *)0x0) {
    pSVar1 = (temp->pointers).le_next;
    if (temp->session != (UA_Session *)0x0) {
      temp->session->channel = (UA_SecureChannel *)0x0;
    }
    if ((temp->pointers).le_next != (SessionEntry *)0x0) {
      (((temp->pointers).le_next)->pointers).le_prev = (temp->pointers).le_prev;
    }
    *(temp->pointers).le_prev = (temp->pointers).le_next;
    free(temp);
    temp = pSVar1;
  }
  temp_ch = (channel->chunks).lh_first;
  while (temp_ch != (ChunkEntry *)0x0) {
    pCVar2 = (temp_ch->pointers).le_next;
    UA_ByteString_deleteMembers(&temp_ch->bytes);
    if ((temp_ch->pointers).le_next != (ChunkEntry *)0x0) {
      (((temp_ch->pointers).le_next)->pointers).le_prev = (temp_ch->pointers).le_prev;
    }
    *(temp_ch->pointers).le_prev = (temp_ch->pointers).le_next;
    free(temp_ch);
    temp_ch = pCVar2;
  }
  return;
}

Assistant:

void UA_SecureChannel_deleteMembersCleanup(UA_SecureChannel *channel) {
    /* Delete members */
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->serverAsymAlgSettings);
    UA_ByteString_deleteMembers(&channel->serverNonce);
    UA_AsymmetricAlgorithmSecurityHeader_deleteMembers(&channel->clientAsymAlgSettings);
    UA_ByteString_deleteMembers(&channel->clientNonce);
    UA_ChannelSecurityToken_deleteMembers(&channel->securityToken);
    UA_ChannelSecurityToken_deleteMembers(&channel->nextSecurityToken);

    /* Detach from the channel */
    if(channel->connection)
        UA_Connection_detachSecureChannel(channel->connection);

    /* Remove session pointers (not the sessions) */
    struct SessionEntry *se, *temp;
    LIST_FOREACH_SAFE(se, &channel->sessions, pointers, temp) {
        if(se->session)
            se->session->channel = NULL;
        LIST_REMOVE(se, pointers);
        UA_free(se);
    }

    /* Remove the buffered chunks */
    struct ChunkEntry *ch, *temp_ch;
    LIST_FOREACH_SAFE(ch, &channel->chunks, pointers, temp_ch) {
        UA_ByteString_deleteMembers(&ch->bytes);
        LIST_REMOVE(ch, pointers);
        UA_free(ch);
    }
}